

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,int i)

{
  char *pcVar1;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *in_RDI;
  char *p;
  char *end;
  char buffer [11];
  undefined7 in_stack_ffffffffffffffc8;
  Ch in_stack_ffffffffffffffcf;
  char *local_28;
  char local_17 [23];
  
  pcVar1 = internal::i32toa((int32_t)((ulong)in_RDI >> 0x20),
                            (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  PutReserve<rapidjson::BasicOStreamWrapper<std::ostream>>
            ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
             in_RDI->stream_,(long)pcVar1 - (long)local_17);
  for (local_28 = local_17; local_28 != pcVar1; local_28 = local_28 + 1) {
    PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>(in_RDI,in_stack_ffffffffffffffcf);
  }
  return true;
}

Assistant:

bool WriteInt(int i) {
        char buffer[11];
        const char* end = internal::i32toa(i, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }